

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomColor::write(DomColor *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int iVar2;
  undefined4 in_register_00000034;
  QAnyStringView *str_00;
  long in_FS_OFFSET;
  char16_t *str;
  DataPointer *in_stack_fffffffffffffe08;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffe10;
  QAnyStringView *in_stack_fffffffffffffe18;
  QAnyStringView *in_stack_fffffffffffffe20;
  QAnyStringView *in_stack_fffffffffffffe28;
  undefined1 local_188 [64];
  QAnyStringView *local_148;
  undefined1 local_138 [64];
  QAnyStringView *local_f8;
  undefined1 local_e8 [64];
  QAnyStringView *local_a8;
  undefined1 local_98 [64];
  QAnyStringView *local_58;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  str_00 = (QAnyStringView *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x1b29b9);
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"color",5);
    QString::QString((QString *)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  }
  else {
    QString::toLower((QString *)in_stack_fffffffffffffe08);
  }
  QAnyStringView::QAnyStringView(in_stack_fffffffffffffe20,(QString *)in_stack_fffffffffffffe18);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)str_00);
  QString::~QString((QString *)0x1b2a6c);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffe10);
  }
  bVar1 = hasAttributeAlpha(this);
  if (bVar1) {
    in_stack_fffffffffffffe28 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)str_00,(size_t)in_stack_fffffffffffffe20);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe20,(QString *)in_stack_fffffffffffffe18);
    iVar2 = attributeAlpha(this);
    QString::number((int)local_98,iVar2);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe20,(QString *)in_stack_fffffffffffffe18);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)in_stack_fffffffffffffe28,local_58);
    QString::~QString((QString *)0x1b2b37);
    QString::~QString((QString *)0x1b2b44);
  }
  if ((this->m_children & 1) != 0) {
    in_stack_fffffffffffffe20 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffe28,(size_t)str_00);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe20,(QString *)in_stack_fffffffffffffe18);
    QString::number((int)local_e8,this->m_red);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe20,(QString *)in_stack_fffffffffffffe18);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)in_stack_fffffffffffffe20,local_a8);
    QString::~QString((QString *)0x1b2bf6);
    QString::~QString((QString *)0x1b2c03);
  }
  if ((this->m_children & 2) != 0) {
    in_stack_fffffffffffffe18 = str_00;
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffe28,(size_t)in_stack_fffffffffffffe20);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe20,(QString *)in_stack_fffffffffffffe18);
    QString::number((int)local_138,this->m_green);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe20,(QString *)in_stack_fffffffffffffe18);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)in_stack_fffffffffffffe18,local_f8);
    QString::~QString((QString *)0x1b2cb5);
    QString::~QString((QString *)0x1b2cc2);
  }
  if ((this->m_children & 4) != 0) {
    Qt::Literals::StringLiterals::operator____s
              ((char16_t *)in_stack_fffffffffffffe28,(size_t)in_stack_fffffffffffffe20);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe20,(QString *)in_stack_fffffffffffffe18);
    QString::number((int)local_188,this->m_blue);
    QAnyStringView::QAnyStringView(in_stack_fffffffffffffe20,(QString *)in_stack_fffffffffffffe18);
    QXmlStreamWriter::writeTextElement((QAnyStringView *)str_00,local_148);
    QString::~QString((QString *)0x1b2d6b);
    QString::~QString((QString *)0x1b2d78);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomColor::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("color") : tagName.toLower());

    if (hasAttributeAlpha())
        writer.writeAttribute(u"alpha"_s, QString::number(attributeAlpha()));

    if (m_children & Red)
        writer.writeTextElement(u"red"_s, QString::number(m_red));

    if (m_children & Green)
        writer.writeTextElement(u"green"_s, QString::number(m_green));

    if (m_children & Blue)
        writer.writeTextElement(u"blue"_s, QString::number(m_blue));

    writer.writeEndElement();
}